

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPSymmetricAlgorithm.cpp
# Opt level: O3

bool __thiscall
OSSLEVPSymmetricAlgorithm::checkMaximumBytes(OSSLEVPSymmetricAlgorithm *this,unsigned_long bytes)

{
  int iVar1;
  BIGNUM *a;
  bool bVar2;
  
  if (this->maximumBytes == (BIGNUM *)0x0) {
    bVar2 = true;
  }
  else {
    a = BN_new();
    BN_copy(a,(BIGNUM *)this->counterBytes);
    BN_add_word(a,bytes);
    iVar1 = BN_cmp((BIGNUM *)this->maximumBytes,a);
    bVar2 = -1 < iVar1;
    BN_free(a);
  }
  return bVar2;
}

Assistant:

bool OSSLEVPSymmetricAlgorithm::checkMaximumBytes(unsigned long bytes)
{
	if (maximumBytes == NULL) return true;

	BIGNUM* bigNum = BN_new();
	BN_copy(bigNum, counterBytes);
	BN_add_word(bigNum, bytes);

	bool rv = false;
	if (BN_cmp(maximumBytes, bigNum) >= 0) rv = true;

	BN_free(bigNum);

	return rv;
}